

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idas.c
# Opt level: O0

void IDAQuadFree(void *ida_mem)

{
  IDAMem in_RDI;
  IDAMem IDA_mem;
  
  if ((in_RDI != (IDAMem)0x0) && (in_RDI->ida_quadMallocDone != 0)) {
    IDAQuadFreeVectors(in_RDI);
    in_RDI->ida_quadMallocDone = 0;
    in_RDI->ida_quadr = 0;
  }
  return;
}

Assistant:

void IDAQuadFree(void* ida_mem)
{
  IDAMem IDA_mem;

  if (ida_mem == NULL) { return; }
  IDA_mem = (IDAMem)ida_mem;

  if (IDA_mem->ida_quadMallocDone)
  {
    IDAQuadFreeVectors(IDA_mem);
    IDA_mem->ida_quadMallocDone = SUNFALSE;
    IDA_mem->ida_quadr          = SUNFALSE;
  }
}